

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizardPrivate::removeFieldAt(QWizardPrivate *this,int index)

{
  QList<QWizardField> *this_00;
  QObject *pQVar1;
  QWizardField *pQVar2;
  Data *pDVar3;
  QWizardField *pQVar4;
  char *pcVar5;
  
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_00 = &this->fields;
  pQVar2 = (this->fields).d.ptr;
  pQVar4 = pQVar2 + index;
  QMap<QString,_int>::remove(&this->fieldIndexMap,(char *)&pQVar2[index].name);
  if ((pQVar2[index].mandatory == true) && ((pQVar4->changedSignal).d.size != 0)) {
    pcVar5 = (pQVar4->changedSignal).d.ptr;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect(pQVar4->object,pcVar5,(QObject *)pQVar4->page,
                        "1_q_maybeEmitCompleteChanged()");
  }
  QObject::disconnect(pQVar4->object,"2destroyed(QObject*)",pQVar1,
                      "1_q_handleFieldObjectDestroyed(QObject*)");
  pDVar3 = (this_00->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QWizardField>::reallocateAndGrow
              (&this_00->d,GrowsAtEnd,0,(QArrayDataPointer<QWizardField> *)0x0);
  }
  QtPrivate::QMovableArrayOps<QWizardField>::erase
            ((QMovableArrayOps<QWizardField> *)this_00,(this->fields).d.ptr + index,1);
  return;
}

Assistant:

void QWizardPrivate::removeFieldAt(int index)
{
    Q_Q(QWizard);

    const QWizardField &field = fields.at(index);
    fieldIndexMap.remove(field.name);
    if (field.mandatory && !field.changedSignal.isEmpty())
        QObject::disconnect(field.object, field.changedSignal,
                            field.page, SLOT(_q_maybeEmitCompleteChanged()));
    QObject::disconnect(
        field.object, SIGNAL(destroyed(QObject*)), q,
        SLOT(_q_handleFieldObjectDestroyed(QObject*)));
    fields.remove(index);
}